

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgst07.c
# Opt level: O1

int cgst07(trans_t trans,int n,int nrhs,SuperMatrix *A,singlecomplex *b,int ldb,singlecomplex *x,
          int ldx,singlecomplex *xact,int ldxact,float *ferr,float *berr,float *reslts)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  integer iVar6;
  int iVar7;
  float *addr;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int c__1;
  int n__1;
  integer local_164;
  ulong local_160;
  long local_158;
  long local_150;
  long local_148;
  ulong local_140;
  int local_138 [66];
  
  uVar15 = (ulong)(uint)n;
  local_164 = 1;
  if (n < 1 || nrhs < 1) {
    reslts[0] = 0.0;
    reslts[1] = 0.0;
  }
  else {
    fVar16 = smach("Epsilon");
    fVar17 = smach("Safe minimum");
    addr = (float *)superlu_malloc(uVar15 * 4);
    if (addr == (float *)0x0) {
      sprintf((char *)local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0x71,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cgst07.c"
             );
      superlu_abort_and_exit((char *)local_138);
    }
    pvVar2 = A->Store;
    lVar3 = *(long *)((long)pvVar2 + 8);
    lVar8 = (long)ldx;
    local_160 = (ulong)(uint)nrhs;
    if (nrhs < 1) {
      fVar18 = 0.0;
    }
    else {
      pfVar13 = &xact->i;
      local_150 = (long)ldxact << 3;
      pfVar12 = &x->i;
      local_158 = lVar8 * 8;
      fVar18 = 0.0;
      uVar9 = 0;
      do {
        local_148 = uVar9 * lVar8;
        local_140 = uVar9;
        local_138[0] = n;
        iVar6 = icamax_(local_138,x + local_148,&local_164);
        fVar19 = 0.0;
        if (0 < n) {
          uVar9 = 0;
          do {
            fVar20 = ABS(pfVar12[uVar9 * 2] - pfVar13[uVar9 * 2]) +
                     ABS(pfVar12[uVar9 * 2 + -1] - pfVar13[uVar9 * 2 + -1]);
            if (fVar19 <= fVar20) {
              fVar19 = fVar20;
            }
            uVar9 = uVar9 + 1;
          } while (uVar15 != uVar9);
        }
        iVar7 = iVar6 + (int)local_148 + -1;
        fVar20 = ABS(x[iVar7].i) + ABS(x[iVar7].r);
        if (fVar20 <= fVar17) {
          fVar20 = fVar17;
        }
        if (((1.0 < fVar20) || (fVar5 = 1.0 / fVar16, fVar19 <= (1.0 / fVar17) * fVar20)) &&
           (fVar19 = (fVar19 / fVar20) / ferr[local_140], fVar5 = fVar18, fVar18 <= fVar19)) {
          fVar5 = fVar19;
        }
        fVar18 = fVar5;
        uVar9 = local_140 + 1;
        pfVar13 = (float *)((long)pfVar13 + local_150);
        pfVar12 = (float *)((long)pfVar12 + local_158);
      } while (uVar9 != local_160);
    }
    *reslts = fVar18;
    if (0 < nrhs) {
      fVar17 = fVar17 * (float)(n + 1);
      pfVar12 = &b->i;
      uVar9 = 0;
      do {
        if (0 < n) {
          uVar10 = 0;
          do {
            addr[uVar10] = ABS(pfVar12[uVar10 * 2]) + ABS(pfVar12[uVar10 * 2 + -1]);
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
        }
        if (trans == NOTRANS) {
          if (0 < n) {
            lVar4 = *(long *)((long)pvVar2 + 0x18);
            uVar10 = 0;
            do {
              iVar7 = *(int *)(lVar4 + uVar10 * 4);
              lVar11 = (long)iVar7;
              iVar1 = *(int *)(lVar4 + 4 + uVar10 * 4);
              if (iVar7 < iVar1) {
                fVar18 = x[uVar9 * lVar8 + uVar10].r;
                fVar19 = x[uVar9 * lVar8 + uVar10].i;
                lVar14 = *(long *)((long)pvVar2 + 0x10);
                do {
                  iVar7 = *(int *)(lVar14 + lVar11 * 4);
                  addr[iVar7] = (ABS(*(float *)(lVar3 + 4 + lVar11 * 8)) +
                                ABS(*(float *)(lVar3 + lVar11 * 8))) * (ABS(fVar19) + ABS(fVar18)) +
                                addr[iVar7];
                  lVar11 = lVar11 + 1;
                } while (iVar1 != lVar11);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar15);
          }
        }
        else if (0 < n) {
          lVar4 = *(long *)((long)pvVar2 + 0x18);
          uVar10 = 0;
          do {
            iVar7 = *(int *)(lVar4 + uVar10 * 4);
            lVar11 = (long)iVar7;
            iVar1 = *(int *)(lVar4 + 4 + uVar10 * 4);
            fVar18 = 0.0;
            if (iVar7 < iVar1) {
              do {
                lVar14 = (long)*(int *)(*(long *)((long)pvVar2 + 0x10) + lVar11 * 4);
                fVar18 = fVar18 + (ABS(*(float *)(lVar3 + 4 + lVar11 * 8)) +
                                  ABS(*(float *)(lVar3 + lVar11 * 8))) *
                                  (ABS(x[uVar9 * lVar8 + lVar14].i) +
                                  ABS(x[uVar9 * lVar8 + lVar14].r));
                lVar11 = lVar11 + 1;
              } while (iVar1 != lVar11);
            }
            addr[uVar10] = fVar18 + addr[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar15);
        }
        fVar18 = *addr;
        if (1 < n) {
          uVar10 = 1;
          do {
            if (addr[uVar10] <= fVar18) {
              fVar18 = addr[uVar10];
            }
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
        }
        if (fVar18 <= fVar17) {
          fVar18 = fVar17;
        }
        fVar18 = berr[uVar9] / (fVar17 / fVar18 + fVar16 * (float)(n + 1));
        if (uVar9 == 0) {
          reslts[1] = fVar18;
        }
        else {
          fVar19 = reslts[1];
          if (reslts[1] <= fVar18) {
            fVar19 = fVar18;
          }
          reslts[1] = fVar19;
        }
        uVar9 = uVar9 + 1;
        pfVar12 = pfVar12 + (long)ldb * 2;
      } while (uVar9 != local_160);
    }
    superlu_free(addr);
  }
  return 0;
}

Assistant:

int cgst07(trans_t trans, int n, int nrhs, SuperMatrix *A, singlecomplex *b,
           int ldb, singlecomplex *x, int ldx, singlecomplex *xact,
           int ldxact, float *ferr, float *berr, float *reslts)
{
    /* Table of constant values */
    int c__1 = 1;

    /* System generated locals */
    float d__1, d__2;
    float d__3, d__4;

    /* Local variables */
    float diff, axbi;
    int    imax, irow, n__1;
    int    i, j, k;
    float unfl, ovfl;
    float xnorm;
    float errbnd;
    int    notran;
    float eps, tmp;
    float *rwork;
    singlecomplex *Aval;
    NCformat *Astore;

    /* Function prototypes */
    extern int    icamax_(int *, singlecomplex *, int *);


    /* Quick exit if N = 0 or NRHS = 0. */
    if ( n <= 0 || nrhs <= 0 ) {
	reslts[0] = 0.;
	reslts[1] = 0.;
	return 0;
    }

    eps = smach("Epsilon");
    unfl = smach("Safe minimum");
    ovfl   = 1. / unfl;
    notran = (trans == NOTRANS);

    rwork  = (float *) SUPERLU_MALLOC(n*sizeof(float));
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");
    Astore = A->Store;
    Aval   = (singlecomplex *) Astore->nzval;
    
    /* Test 1:  Compute the maximum of   
       norm(X - XACT) / ( norm(X) * FERR )   
       over all the vectors X and XACT using the infinity-norm. */

    errbnd = 0.;
    for (j = 0; j < nrhs; ++j) {
	n__1 = n;
	imax = icamax_(&n__1, &x[j*ldx], &c__1);
	d__1 = (d__2 = x[imax-1 + j*ldx].r, fabs(d__2)) + 
               (d__3 = x[imax-1 + j*ldx].i, fabs(d__3));
	xnorm = SUPERLU_MAX(d__1,unfl);
	diff = 0.;
	for (i = 0; i < n; ++i) {
	    d__1 = (d__2 = x[i+j*ldx].r - xact[i+j*ldxact].r, fabs(d__2)) +
                   (d__3 = x[i+j*ldx].i - xact[i+j*ldxact].i, fabs(d__3));
	    diff = SUPERLU_MAX(diff, d__1);
	}

	if (xnorm > 1.) {
	    goto L20;
	} else if (diff <= ovfl * xnorm) {
	    goto L20;
	} else {
	    errbnd = 1. / eps;
	    goto L30;
	}

L20:
#if 0	
	if (diff / xnorm <= ferr[j]) {
	    d__1 = diff / xnorm / ferr[j];
	    errbnd = SUPERLU_MAX(errbnd,d__1);
	} else {
	    errbnd = 1. / eps;
	}
#endif
	d__1 = diff / xnorm / ferr[j];
	errbnd = SUPERLU_MAX(errbnd,d__1);
	/*printf("Ferr: %f\n", errbnd);*/
L30:
	;
    }
    reslts[0] = errbnd;

    /* Test 2: Compute the maximum of BERR / ( (n+1)*EPS + (*) ), where 
       (*) = (n+1)*UNFL / (min_i (abs(op(A))*abs(X) + abs(b))_i ) */

    for (k = 0; k < nrhs; ++k) {
	for (i = 0; i < n; ++i) 
            rwork[i] = (d__1 = b[i + k*ldb].r, fabs(d__1)) +
                       (d__2 = b[i + k*ldb].i, fabs(d__2));
	if ( notran ) {
	    for (j = 0; j < n; ++j) {
		tmp = (d__1 = x[j + k*ldx].r, fabs(d__1)) +
                      (d__2 = x[j + k*ldx].i, fabs(d__2));
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    d__1 = (d__2 = Aval[i].r, fabs(d__2)) +
                           (d__3 = Aval[i].i, fabs(d__3));
		    rwork[Astore->rowind[i]] += d__1 * tmp;
                }
	    }
	} else {
	    for (j = 0; j < n; ++j) {
		tmp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    d__1 = (d__2 = x[irow + k*ldx].r, fabs(d__2)) +
                           (d__3 = x[irow + k*ldx].i, fabs(d__3));
                    d__2 = (d__3 = Aval[i].r, fabs(d__3)) +
                           (d__4 = Aval[i].i, fabs(d__4));
		    tmp += d__2 * d__1;
		}
		rwork[j] += tmp;
	    }
	}

	axbi = rwork[0];
	for (i = 1; i < n; ++i) axbi = SUPERLU_MIN(axbi, rwork[i]);
	
	/* Computing MAX */
	d__1 = axbi, d__2 = (n + 1) * unfl;
	tmp = berr[k] / ((n + 1) * eps + (n + 1) * unfl / SUPERLU_MAX(d__1,d__2));
	
	if (k == 0) {
	    reslts[1] = tmp;
	} else {
	    reslts[1] = SUPERLU_MAX(reslts[1],tmp);
	}
    }

    SUPERLU_FREE(rwork);
    return 0;

}